

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O0

int run_test_threadpool_cancel_random(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  random_info req;
  
  saturate_threadpool();
  puVar2 = uv_default_loop();
  iVar1 = uv_random(puVar2,(uv_random_t *)&loop,req.random_req.work_req.wq + 1,1,0,nop_random_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xf4,
            "0 == uv_random(loop, &req.random_req, &req.buf, sizeof(req.buf), 0, nop_random_cb)");
    abort();
  }
  iVar1 = uv_cancel((uv_req_t *)&loop);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xf5,"0 == uv_cancel((uv_req_t*) &req)");
    abort();
  }
  if (done_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xf6,"0 == done_cb_called");
    abort();
  }
  unblock_threadpool();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xf8,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (done_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xf9,"1 == done_cb_called");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xfb,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(threadpool_cancel_random) {
  struct random_info req;
  uv_loop_t* loop;

  saturate_threadpool();
  loop = uv_default_loop();
  ASSERT(0 == uv_random(loop,
                        &req.random_req,
                        &req.buf,
                        sizeof(req.buf),
                        0,
                        nop_random_cb));
  ASSERT(0 == uv_cancel((uv_req_t*) &req));
  ASSERT(0 == done_cb_called);
  unblock_threadpool();
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == done_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}